

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_mark(global_State *g,GCobj *o)

{
  uint8_t uVar1;
  GCobj *o_00;
  GCupval *uv;
  SBufExt *sbx;
  GCtab *mt;
  int gct;
  GCobj *o_local;
  global_State *g_local;
  
  uVar1 = (o->gch).gct;
  (o->gch).marked = (o->gch).marked & 0xfc;
  if (uVar1 == '\f') {
    o_00 = (GCobj *)(o->th).base;
    (o->gch).marked = (o->gch).marked | 4;
    if ((o_00 != (GCobj *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      gc_mark(g,o_00);
    }
    if ((*(byte *)((o->gch).env.gcptr64 + 8) & 3) != 0) {
      gc_mark(g,(GCobj *)(o->gch).env.gcptr64);
    }
    if ((o->gch).unused1 == '\x03') {
      if (((((o->th).env.gcptr64 & 2) != 0) && ((o->th).cframe != (void *)0x0)) &&
         ((*(byte *)((long)(o->th).cframe + 8) & 3) != 0)) {
        gc_mark(g,(GCobj *)(o->th).cframe);
      }
      if (((o->pt).varinfo.ptr64 != 0) && ((*(byte *)((o->pt).varinfo.ptr64 + 8) & 3) != 0)) {
        gc_mark(g,(GCobj *)(o->pt).varinfo.ptr64);
      }
      if ((o[1].gch.nextgc.gcptr64 != 0) && ((*(byte *)(o[1].gch.nextgc.gcptr64 + 8) & 3) != 0)) {
        gc_mark(g,(GCobj *)o[1].gch.nextgc.gcptr64);
      }
    }
  }
  else if (uVar1 == '\x05') {
    if ((0xfffffff6 < ((int)(((o->th).base)->field_4).it >> 0xf) + 4U) &&
       ((*(byte *)((((o->th).base)->u64 & 0x7fffffffffff) + 8) & 3) != 0)) {
      gc_mark(g,(GCobj *)(((o->th).base)->u64 & 0x7fffffffffff));
    }
    if ((o->gch).unused1 != '\0') {
      (o->gch).marked = (o->gch).marked | 4;
    }
  }
  else if ((uVar1 != '\x04') && (uVar1 != '\n')) {
    (o->gch).gclist.gcptr64 = (g->gc).gray.gcptr64;
    (g->gc).gray.gcptr64 = (uint64_t)o;
  }
  return;
}

Assistant:

static void gc_mark(global_State *g, GCobj *o)
{
  int gct = o->gch.gct;
  lj_assertG(iswhite(o), "mark of non-white object");
  lj_assertG(!isdead(g, o), "mark of dead object");
  white2gray(o);
  if (LJ_UNLIKELY(gct == ~LJ_TUDATA)) {
    GCtab *mt = tabref(gco2ud(o)->metatable);
    gray2black(o);  /* Userdata are never gray. */
    if (mt) gc_markobj(g, mt);
    gc_markobj(g, tabref(gco2ud(o)->env));
    if (LJ_HASBUFFER && gco2ud(o)->udtype == UDTYPE_BUFFER) {
      SBufExt *sbx = (SBufExt *)uddata(gco2ud(o));
      if (sbufiscow(sbx) && gcref(sbx->cowref))
	gc_markobj(g, gcref(sbx->cowref));
      if (gcref(sbx->dict_str))
	gc_markobj(g, gcref(sbx->dict_str));
      if (gcref(sbx->dict_mt))
	gc_markobj(g, gcref(sbx->dict_mt));
    }
  } else if (LJ_UNLIKELY(gct == ~LJ_TUPVAL)) {
    GCupval *uv = gco2uv(o);
    gc_marktv(g, uvval(uv));
    if (uv->closed)
      gray2black(o);  /* Closed upvalues are never gray. */
  } else if (gct != ~LJ_TSTR && gct != ~LJ_TCDATA) {
    lj_assertG(gct == ~LJ_TFUNC || gct == ~LJ_TTAB ||
	       gct == ~LJ_TTHREAD || gct == ~LJ_TPROTO || gct == ~LJ_TTRACE,
	       "bad GC type %d", gct);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}